

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmNegEa<(moira::Instr)84,(moira::Mode)7,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)7,_(moira::Size)1> dst;
  Ea<(moira::Mode)7,_(moira::Size)1> local_2c;
  
  local_2c.reg = op & 7;
  local_2c.pc = *addr;
  local_2c.ext1 = dasmRead<(moira::Size)2>(this,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  StrWriter::operator<<(pSVar1,&local_2c);
  return;
}

Assistant:

void
Moira::dasmNegEa(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << dst;
}